

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O3

void fsnav_ins_print_progress(void)

{
  fsnav_imu *pfVar1;
  undefined8 in_RAX;
  char bkspc [6];
  undefined6 local_8;
  undefined2 uStack_2;
  
  _local_8 = CONCAT26((short)((ulong)in_RAX >> 0x30),0x800000000);
  _local_8 = CONCAT44(stack0xfffffffffffffffc,0x8080808);
  pfVar1 = fsnav->imu;
  if (pfVar1 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      printf("seconds into navigation: % *.0f",pfVar1->t,5);
      fsnav_ins_print_progress::counter = 0;
    }
    else if (fsnav->mode < 0) {
      printf("%s% *.0f",pfVar1->t,&local_8,5);
    }
    else {
      if ((fsnav_ins_print_progress::counter & 0x3ffU) == 0) {
        printf("%s% *.0f",pfVar1->t,&local_8,5);
      }
      fsnav_ins_print_progress::counter = fsnav_ins_print_progress::counter + 1;
    }
  }
  return;
}

Assistant:

void fsnav_ins_print_progress(void)
{	
	const char bkspc[] = "\b\b\b\b\b"; // возврат курсора
	const int 
		decimals = sizeof(bkspc)-1,    // количество выводимых десятичных знаков целой части
		interval = 1024;               // интервал вывода, в шагах
	static long counter;               // счётчик

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация частного алгоритма
	if (fsnav->mode == 0) {
		printf("seconds into navigation: % *.0f", decimals, fsnav->imu->t);
		counter = 0; // сброс счётчика
	}

	// завершение работы
	else if (fsnav->mode < 0)
		printf("%s% *.0f", bkspc, decimals, fsnav->imu->t); // печать конечного времени

	// операции на каждом шаге
	else {
		// печать на экран
		if (counter%interval == 0)
			printf("%s% *.0f", bkspc, decimals, fsnav->imu->t);
		counter++;
	}
}